

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O0

bool __thiscall
Clasp::ClaspBerkmin::bump(ClaspBerkmin *this,Solver *s,WeightLitVec *lits,double adj)

{
  uint uVar1;
  uint32 uVar2;
  Var n;
  uint *puVar3;
  reference pHVar4;
  pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
  *in_RDX;
  long in_RDI;
  double in_XMM0_Qa;
  uint32 xf;
  const_iterator end;
  const_iterator it;
  Var in_stack_ffffffffffffff8c;
  Order *in_stack_ffffffffffffff90;
  Solver *in_stack_ffffffffffffff98;
  bool local_49;
  uint local_3c;
  uint local_38;
  uint8 local_31;
  const_iterator local_30;
  const_iterator local_28;
  double local_20;
  pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
  *local_18;
  
  local_20 = in_XMM0_Qa;
  local_18 = in_RDX;
  local_28 = bk_lib::
             pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
             ::begin(in_RDX);
  local_30 = bk_lib::
             pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
             ::end(local_18);
  for (; local_28 != local_30; local_28 = local_28 + 1) {
    local_49 = true;
    if ((*(byte *)(in_RDI + 0x1d) & 1) != 0) {
      Literal::var(&local_28->first);
      local_31 = (uint8)Solver::varInfo(in_stack_ffffffffffffff98,
                                        (Var)((ulong)in_stack_ffffffffffffff90 >> 0x20));
      local_49 = VarInfo::nant((VarInfo *)0x234640);
    }
    if (local_49 != false) {
      in_stack_ffffffffffffff90 = (Order *)(in_RDI + 8);
      Literal::var(&local_28->first);
      uVar2 = Order::decayedScore(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      local_38 = uVar2 + (int)((double)local_28->second * local_20);
      local_3c = 0xffff;
      puVar3 = std::min<unsigned_int>(&local_38,&local_3c);
      uVar1 = *puVar3;
      in_stack_ffffffffffffff98 = (Solver *)(in_RDI + 8);
      n = Literal::var(&local_28->first);
      pHVar4 = bk_lib::
               pod_vector<Clasp::ClaspBerkmin::HScore,_std::allocator<Clasp::ClaspBerkmin::HScore>_>
               ::operator[]((pod_vector<Clasp::ClaspBerkmin::HScore,_std::allocator<Clasp::ClaspBerkmin::HScore>_>
                             *)in_stack_ffffffffffffff98,n);
      pHVar4->act = (uint16)uVar1;
    }
  }
  return true;
}

Assistant:

bool ClaspBerkmin::bump(const Solver& s, const WeightLitVec& lits, double adj) {
	for (WeightLitVec::const_iterator it = lits.begin(), end = lits.end(); it != end; ++it) {
		if (!order_.nant || s.varInfo(it->first.var()).nant()) {
			uint32 xf = order_.decayedScore(it->first.var()) + static_cast<weight_t>(it->second*adj);
			order_.score[it->first.var()].act = (uint16)std::min(xf, UINT32_MAX>>16);
		}
	}
	return true;
}